

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O3

wchar_t rar5_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  int64_t *piVar1;
  wchar_t *pwVar2;
  undefined1 *puVar3;
  uint8_t *puVar4;
  byte bVar5;
  char cVar6;
  compressed_block_header cVar7;
  ushort uVar8;
  ushort uVar9;
  uint16_t uVar10;
  ushort uVar11;
  rar5 *rar;
  void *pvVar12;
  rar5 *rar_00;
  decode_table *pdVar13;
  bool bVar14;
  archive_read *paVar15;
  byte bVar16;
  wchar_t wVar17;
  int iVar18;
  wchar_t wVar19;
  int iVar20;
  size_t sVar21;
  uint8_t *puVar22;
  compressed_block_header *pcVar23;
  void *pvVar24;
  uint8_t *puVar25;
  uint *puVar26;
  int64_t iVar27;
  rar5 *prVar28;
  long lVar29;
  long lVar30;
  uint uVar31;
  uint uVar32;
  char *pcVar33;
  size_t sVar34;
  decode_table *pdVar35;
  decode_table *pdVar36;
  ulong uVar37;
  uint uVar38;
  uint8_t uVar39;
  short sVar40;
  ulong uVar41;
  uint8_t *puVar42;
  ulong uVar43;
  long lVar44;
  undefined8 *__dest;
  long lVar45;
  rar5 *prVar46;
  rar5 *prVar47;
  data_ready *pdVar48;
  uint8_t *puVar49;
  uint16_t num;
  uint16_t num_1;
  uint8_t bit_length [20];
  uint8_t table [430];
  ushort local_26a;
  rar5 *local_268;
  rar5 *local_260;
  uint8_t *local_258;
  uint8_t *local_250;
  archive_read *local_248;
  decode_table *local_240;
  wchar_t local_238;
  ushort local_232;
  decode_table *local_230;
  decode_table *local_228;
  uint local_21c;
  uint local_218 [6];
  ulong local_200;
  ulong local_1f8;
  decode_table *local_1f0;
  undefined1 local_1e8 [306];
  uint8_t local_b6 [64];
  uint8_t local_76 [16];
  uint8_t local_66 [54];
  
  rar = (rar5 *)a->format->data;
  if (size != (size_t *)0x0) {
    *size = 0;
  }
  bVar16 = (rar->file).field_0x20;
  if ((bVar16 & 8) != 0) {
    archive_set_error(&a->archive,0x54,"Can\'t decompress an entry marked as a directory");
    return L'\xffffffe7';
  }
  if ((rar->skip_mode == L'\0') && ((rar->file).unpacked_size < (rar->cstate).last_write_ptr)) {
    pcVar33 = "Unpacker has written too many bytes";
    goto LAB_00565662;
  }
  if ((rar->cstate).dready[0].used != '\0') {
    pdVar48 = (rar->cstate).dready;
LAB_005656b6:
    if (buff != (void **)0x0) {
      *buff = pdVar48->buf;
    }
    if (size != (size_t *)0x0) {
      *size = pdVar48->size;
    }
    if (offset != (int64_t *)0x0) {
      *offset = pdVar48->offset;
    }
    pdVar48->used = '\0';
    return L'\0';
  }
  if ((rar->cstate).dready[1].used != '\0') {
    pdVar48 = (rar->cstate).dready + 1;
    goto LAB_005656b6;
  }
  if ((bVar16 & 4) != 0) {
    return L'\x01';
  }
  if ((bVar16 & 2) == 0) {
    wVar19 = (rar->cstate).method;
    puVar49 = (uint8_t *)(ulong)(uint)wVar19;
    paVar15 = a;
    if (4 < (uint)(wVar19 + L'\xffffffff')) {
      if (wVar19 != L'\0') {
        pcVar33 = "Compression method not supported: 0x%x";
LAB_00566646:
        archive_set_error(&a->archive,0x54,pcVar33,puVar49);
        return L'\xffffffe2';
      }
      goto LAB_00566596;
    }
    do {
      local_248 = paVar15;
      prVar47 = (rar5 *)a->format->data;
      bVar16 = *(byte *)&prVar47->cstate;
      if ((bVar16 & 1) == 0) {
        puVar49 = (prVar47->cstate).window_buf;
        if (((ulong)prVar47->main & 1) == 0) {
LAB_00565748:
          (prVar47->file).calculated_crc32 = 0;
          lVar29 = (prVar47->cstate).window_size;
          sVar21 = lVar29 - 1;
          if (lVar29 == 0) {
            sVar21 = 0;
          }
          (prVar47->cstate).window_mask = sVar21;
          free(puVar49);
          free((prVar47->cstate).filtered_buf);
          sVar34 = (prVar47->cstate).window_size;
          puVar49 = (uint8_t *)0x0;
          puVar22 = (uint8_t *)0x0;
          if (0 < (long)sVar34) {
            puVar49 = (uint8_t *)calloc(1,sVar34);
            puVar22 = (uint8_t *)calloc(1,sVar34);
          }
          (prVar47->cstate).window_buf = puVar49;
          (prVar47->cstate).filtered_buf = puVar22;
          (prVar47->cstate).write_ptr = 0;
          (prVar47->cstate).last_write_ptr = 0;
          memset(&(prVar47->cstate).bd,0,0x4a9c);
          bVar16 = *(byte *)&prVar47->cstate;
        }
        else if (puVar49 == (uint8_t *)0x0) {
          puVar49 = (uint8_t *)0x0;
          goto LAB_00565748;
        }
        bVar16 = bVar16 | 1;
        *(byte *)&prVar47->cstate = bVar16;
      }
      if ((prVar47->cstate).window_size == 0) {
        pcVar33 = "Invalid window size declaration in this file";
LAB_0056662a:
        iVar20 = 0x54;
        goto LAB_00565667;
      }
      prVar46 = prVar47;
      if ((bVar16 & 2) != 0) {
        do {
          local_268 = prVar46;
          prVar46 = (rar5 *)a->format->data;
          if (((((ulong)prVar46->main & 2) == 0) || ((prVar46->file).bytes_remaining != 0)) ||
             (wVar19 = advance_multivolume(a), wVar19 == L'\0')) {
            local_260 = prVar46;
            if ((undefined1  [19312])
                ((undefined1  [19312])prVar46->cstate & (undefined1  [19312])0x8) ==
                (undefined1  [19312])0x0) {
              puVar49 = (prVar46->cstate).block_buf;
            }
            else {
              local_1e8._0_8_ = 0xffffffffffffffff;
              pcVar23 = (compressed_block_header *)__archive_read_ahead(a,6,(ssize_t *)local_1e8);
              if (pcVar23 == (compressed_block_header *)0x0) {
                return L'\x01';
              }
              cVar7 = *pcVar23;
              prVar46->last_block_hdr = cVar7;
              bVar16 = cVar7.block_flags_u8 >> 3 & 7;
              puVar49 = (uint8_t *)(ulong)bVar16;
              if (2 < bVar16) {
                pcVar33 = "Unsupported block header size (was %d, max is 2)";
                goto LAB_00566646;
              }
              if (bVar16 == 2) {
                puVar49 = (uint8_t *)(ulong)(*(uint *)(pcVar23 + 1) & 0xffffff);
              }
              else if (bVar16 == 1) {
                puVar49 = (uint8_t *)(ulong)(ushort)pcVar23[1];
              }
              else {
                puVar49 = (uint8_t *)(ulong)pcVar23[1].block_flags_u8;
              }
              if ((((uint)((ulong)puVar49 >> 0x10) ^ (uint)puVar49 ^
                   (uint)((ulong)puVar49 >> 8) ^ (uint)(byte)(cVar7.block_flags_u8 ^ 0x5a)) & 0xff)
                  != (uint)((ushort)cVar7 >> 8)) {
                archive_set_error(&a->archive,0x54,"Block checksum error: got 0x%x, expected 0x%x");
                return L'\xffffffe2';
              }
              uVar41 = (ulong)(byte)(bVar16 + 3);
              local_250 = puVar49;
              uVar37 = __archive_read_consume(a,uVar41);
              puVar22 = local_250;
              if (uVar37 != uVar41) {
                return L'\x01';
              }
              lVar29 = (prVar46->file).bytes_remaining - uVar41;
              (prVar46->file).bytes_remaining = lVar29;
              if (lVar29 < (long)local_250) {
                pvVar12 = a->format->data;
                if (*(int *)((long)pvVar12 + 0xc) != 0) {
                  pcVar33 = "Recursive merge is not allowed";
                  goto LAB_00565662;
                }
                *(byte *)((long)pvVar12 + 0x38) = *(byte *)((long)pvVar12 + 0x38) | 4;
                if (*(void **)((long)pvVar12 + 0x5320) != (void *)0x0) {
                  free(*(void **)((long)pvVar12 + 0x5320));
                }
                pvVar24 = malloc((size_t)(puVar22 + 8));
                *(void **)((long)pvVar12 + 0x5320) = pvVar24;
                if (pvVar24 == (void *)0x0) {
                  pcVar33 = "Can\'t allocate memory for a merge block buffer.";
                  goto LAB_0056669a;
                }
                puVar49 = (uint8_t *)((long)pvVar24 + (long)puVar22);
                puVar49[0] = '\0';
                puVar49[1] = '\0';
                puVar49[2] = '\0';
                puVar49[3] = '\0';
                puVar49[4] = '\0';
                puVar49[5] = '\0';
                puVar49[6] = '\0';
                puVar49[7] = '\0';
                puVar49 = *(uint8_t **)((long)pvVar12 + 0x4ba8);
                if ((long)puVar22 <= (long)*(uint8_t **)((long)pvVar12 + 0x4ba8)) {
                  puVar49 = puVar22;
                }
                if (puVar49 == (uint8_t *)0x0) {
LAB_00566601:
                  pcVar33 = "Encountered block size == 0 during block merge";
                  a = local_248;
                  goto LAB_0056662a;
                }
                puVar42 = (uint8_t *)0x0;
                while( true ) {
                  local_1e8._0_8_ = 0xffffffffffffffff;
                  pvVar24 = __archive_read_ahead(local_248,(size_t)puVar49,(ssize_t *)local_1e8);
                  if (pvVar24 == (void *)0x0) {
                    return L'\x01';
                  }
                  puVar4 = puVar49 + (long)puVar42;
                  if ((long)puVar22 < (long)puVar4) {
                    pcVar33 = "Consumed too much data when merging blocks.";
                    a = local_248;
                    goto LAB_00565662;
                  }
                  memcpy(puVar42 + *(long *)((long)pvVar12 + 0x5320),pvVar24,(size_t)puVar49);
                  puVar42 = (uint8_t *)__archive_read_consume(local_248,(int64_t)puVar49);
                  a = local_248;
                  if (puVar42 != puVar49) {
                    return L'\x01';
                  }
                  puVar42 = *(uint8_t **)((long)pvVar12 + 0x4ba8);
                  puVar25 = puVar42 + -(long)puVar49;
                  *(uint8_t **)((long)pvVar12 + 0x4ba8) = puVar25;
                  puVar22 = puVar22 + -(long)puVar4;
                  if (puVar22 == (uint8_t *)0x0) break;
                  if (puVar42 == puVar49) {
                    *(int *)((long)pvVar12 + 0xc) = *(int *)((long)pvVar12 + 0xc) + 1;
                    wVar19 = advance_multivolume(local_248);
                    *(int *)((long)pvVar12 + 0xc) = *(int *)((long)pvVar12 + 0xc) + -1;
                    prVar47 = local_268;
                    if (wVar19 != L'\0') goto LAB_00566554;
                    puVar25 = *(uint8_t **)((long)pvVar12 + 0x4ba8);
                  }
                  puVar49 = puVar22;
                  if ((long)puVar25 < (long)puVar22) {
                    puVar49 = puVar25;
                  }
                  puVar42 = puVar4;
                  puVar22 = local_250;
                  if (puVar49 == (uint8_t *)0x0) goto LAB_00566601;
                }
                puVar49 = *(uint8_t **)((long)pvVar12 + 0x5320);
                prVar46 = local_260;
                puVar22 = local_250;
              }
              else {
                *(byte *)&prVar46->cstate = *(byte *)&prVar46->cstate & 0xfb;
                local_1e8._0_8_ = 0xffffffffffffffff;
                puVar49 = (uint8_t *)
                          __archive_read_ahead(a,(size_t)(local_250 + 4),(ssize_t *)local_1e8);
                if (puVar49 == (uint8_t *)0x0) {
                  return L'\x01';
                }
              }
              (prVar46->cstate).block_buf = puVar49;
              (prVar46->cstate).cur_block_size = (ssize_t)puVar22;
              *(byte *)&prVar46->cstate = *(byte *)&prVar46->cstate & 0xf7;
              (prVar46->bits).in_addr = L'\0';
              (prVar46->bits).bit_addr = '\0';
              if ((char)(prVar46->last_block_hdr).block_flags_u8 < '\0') {
                iVar20 = 0;
                uVar32 = 0xf0;
                bVar16 = 4;
                wVar19 = L'\0';
                local_258 = puVar49;
                do {
                  if ((long)puVar22 <= (long)wVar19) {
                    iVar20 = 0x54;
                    pcVar33 = "Truncated data in huffman tables";
                    goto LAB_0056653e;
                  }
                  uVar31 = (local_258[wVar19] & uVar32) >> (bVar16 & 0x1f);
                  wVar19 = wVar19 + (uint)(uVar32 == 0xf);
                  lVar29 = (long)iVar20;
                  if (uVar31 == 0xf) {
                    uVar31 = (uVar32 ^ 0xff) & (uint)local_258[wVar19];
                    bVar5 = (bVar16 ^ 4) & 0x1f;
                    wVar19 = wVar19 + (uint)(uVar32 == 0xf0);
                    if (uVar31 >> bVar5 == 0) {
                      iVar20 = iVar20 + 1;
                      *(undefined1 *)((long)local_218 + lVar29) = 0xf;
                    }
                    else {
                      uVar38 = (uVar31 >> bVar5) + 1;
                      uVar31 = 0x13U - iVar20;
                      if (uVar38 < 0x13U - iVar20) {
                        uVar31 = uVar38;
                      }
                      local_240 = (decode_table *)CONCAT71(local_240._1_7_,bVar16);
                      memset((void *)((long)local_218 + lVar29),0,(ulong)(uVar31 + 1));
                      uVar37 = 0x13U - lVar29;
                      if ((ulong)uVar38 <= 0x13U - lVar29) {
                        uVar37 = (ulong)uVar38;
                      }
                      iVar20 = (int)uVar37 + iVar20 + 1;
                      bVar16 = (byte)local_240;
                    }
                  }
                  else {
                    iVar20 = iVar20 + 1;
                    *(char *)((long)local_218 + lVar29) = (char)uVar31;
                    uVar32 = uVar32 ^ 0xff;
                    bVar16 = bVar16 ^ 4;
                  }
                  puVar49 = local_258;
                  puVar22 = local_250;
                } while (iVar20 < 0x14);
                (local_260->bits).in_addr = wVar19;
                (local_260->bits).bit_addr = bVar16 ^ 4;
                pdVar35 = &(local_260->cstate).bd;
                create_decode_tables((uint8_t *)local_218,pdVar35,L'\x14');
                uVar32 = 0;
                do {
                  wVar19 = decode_number(a,pdVar35,puVar49,(uint16_t *)&local_238);
                  prVar46 = local_260;
                  if (wVar19 != L'\0') {
                    iVar20 = 0x54;
                    pcVar33 = "Decoding huffman tables failed";
                    goto LAB_0056653e;
                  }
                  uVar11 = (ushort)local_238;
                  if ((ushort)local_238 < 0x10) {
                    *(char *)((long)local_1e8 + (long)(int)uVar32) = (char)local_238;
                    uVar32 = uVar32 + 1;
                  }
                  else if ((ushort)local_238 < 0x12) {
                    wVar19 = read_bits_16(a,local_260,local_258,&local_26a);
                    prVar47 = local_268;
                    if (wVar19 != L'\0') goto LAB_00566554;
                    iVar20 = (int)(prVar46->bits).bit_addr + (uint)(uVar11 != 0x10) * 4 + 3;
                    pwVar2 = &(prVar46->bits).in_addr;
                    *pwVar2 = *pwVar2 + (iVar20 >> 3);
                    (prVar46->bits).bit_addr = (byte)iVar20 & 7;
                    if ((int)uVar32 < 1) {
                      iVar20 = 0x54;
                      pcVar33 = "Unexpected error when decoding huffman tables";
                      goto LAB_0056653e;
                    }
                    puVar49 = local_258;
                    prVar46 = local_260;
                    if (uVar32 < 0x1ae) {
                      uVar37 = (ulong)uVar32;
                      iVar20 = uVar32 - 1;
                      lVar29 = 0;
                      uVar31 = uVar32;
                      do {
                        *(undefined1 *)((long)local_1e8 + lVar29 + uVar37) =
                             *(undefined1 *)((long)local_1e8 + (ulong)(uint)(iVar20 + (int)lVar29));
                        uVar32 = uVar31 + 1;
                        if (0x1ac < (int)uVar31) break;
                        sVar40 = (short)lVar29;
                        lVar29 = lVar29 + 1;
                        uVar31 = uVar32;
                      } while ((ushort)((local_26a >> ((uVar11 == 0x10) << 2 | 9U)) +
                                        (ushort)(uVar11 != 0x10) * 8 + 2) != sVar40);
                    }
                  }
                  else {
                    wVar19 = read_bits_16(a,local_260,local_258,&local_26a);
                    prVar47 = local_268;
                    if (wVar19 != L'\0') goto LAB_00566554;
                    uVar31 = (uint)(uVar11 != 0x12);
                    iVar20 = (int)(prVar46->bits).bit_addr + uVar31 * 4 + 3;
                    pwVar2 = &(prVar46->bits).in_addr;
                    *pwVar2 = *pwVar2 + (iVar20 >> 3);
                    (prVar46->bits).bit_addr = (byte)iVar20 & 7;
                    uVar41 = (ulong)((uint)(local_26a >> ((uVar11 == 0x12) << 2 | 9U)) + uVar31 * 8
                                    + 2);
                    uVar37 = (ulong)(0x1ad - uVar32);
                    if (uVar41 <= 0x1ad - uVar32) {
                      uVar37 = uVar41;
                    }
                    memset((void *)((long)local_1e8 + (long)(int)uVar32),0,uVar37 + 1);
                    uVar37 = 0x1ad - (long)(int)uVar32;
                    if (uVar41 <= uVar37) {
                      uVar37 = uVar41;
                    }
                    uVar32 = uVar32 + (int)uVar37 + 1;
                    a = local_248;
                    puVar49 = local_258;
                  }
                } while ((int)uVar32 < 0x1ae);
                create_decode_tables(local_1e8,&(prVar46->cstate).ld,L'Ĳ');
                create_decode_tables(local_b6,&(prVar46->cstate).dd,L'@');
                create_decode_tables(local_76,&(prVar46->cstate).ldd,L'\x10');
                create_decode_tables(local_66,&(prVar46->cstate).rd,L',');
              }
            }
            prVar28 = (rar5 *)a->format->data;
            if ((prVar28->cstate).write_ptr - (prVar28->cstate).last_write_ptr <=
                (prVar28->cstate).window_size >> 1) {
              local_258 = (uint8_t *)(prVar28->cstate).window_mask;
              local_250 = (uint8_t *)
                          (CONCAT71(local_250._1_7_,(prVar28->last_block_hdr).block_flags_u8) &
                          0xffffffffffffff07);
              pdVar35 = &(prVar28->cstate).ld;
              local_230 = &(prVar28->cstate).rd;
              local_228 = &(prVar28->cstate).dd;
              local_1f0 = &(prVar28->cstate).ldd;
              local_240 = pdVar35;
LAB_00565b9d:
              lVar30 = (long)(prVar28->bits).in_addr;
              lVar29 = (prVar28->cstate).cur_block_size;
              if ((lVar29 <= lVar30) ||
                 ((lVar29 + -1 == lVar30 && ((char)local_250 < (prVar28->bits).bit_addr)))) {
                *(byte *)&prVar28->cstate = *(byte *)&prVar28->cstate | 8;
                goto LAB_0056609e;
              }
              wVar19 = decode_number(a,pdVar35,puVar49,&local_232);
              if (wVar19 != L'\0') {
                wVar19 = L'\x01';
                prVar47 = local_268;
                goto LAB_00566554;
              }
              if (local_232 < 0x100) {
                lVar29 = (prVar28->cstate).write_ptr;
                (prVar28->cstate).write_ptr = lVar29 + 1;
                (prVar28->cstate).window_buf
                [lVar29 + (prVar28->cstate).solid_offset & (ulong)local_258] = (uint8_t)local_232;
                goto LAB_0056607f;
              }
              uVar32 = (uint)local_232;
              if (uVar32 < 0x106) {
                if (local_232 == 0x101) {
                  wVar19 = (prVar28->cstate).last_len;
                  if ((wVar19 == L'\0') ||
                     (wVar19 = copy_string((archive_read *)a->format->data,wVar19,
                                           (prVar28->cstate).dist_cache[0]), wVar19 == L'\0'))
                  goto LAB_0056607f;
                  goto LAB_00566545;
                }
                if (uVar32 == 0x100) {
                  rar_00 = (rar5 *)a->format->data;
                  wVar19 = parse_filter_data(a,rar_00,puVar49,(uint32_t *)local_1e8);
                  prVar47 = local_268;
                  if (((wVar19 != L'\0') ||
                      (wVar19 = parse_filter_data(a,rar_00,puVar49,local_218), prVar47 = local_268,
                      wVar19 != L'\0')) ||
                     (wVar19 = read_bits_16(a,rar_00,puVar49,&local_26a), prVar47 = local_268,
                     wVar19 != L'\0')) goto LAB_00566554;
                  iVar20 = (rar_00->bits).bit_addr + 3;
                  pwVar2 = &(rar_00->bits).in_addr;
                  *pwVar2 = *pwVar2 + (iVar20 >> 3);
                  (rar_00->bits).bit_addr = (byte)iVar20 & 7;
                  if ((0xffc00002 < local_218[0] - 0x400001) && (-1 < (short)local_26a)) {
                    lVar29 = (rar_00->cstate).last_block_start;
                    lVar30 = (rar_00->cstate).last_block_length;
                    if ((lVar30 == 0 || lVar29 == 0) ||
                       (lVar30 + lVar29 <=
                        (long)((rar_00->cstate).write_ptr + (local_1e8._0_8_ & 0xffffffff)))) {
                      local_21c = (uint)local_26a;
                      local_200 = local_1e8._0_8_ & 0xffffffff;
                      local_1f8 = (ulong)local_218[0];
                      puVar26 = (uint *)calloc(1,0x28);
                      if (puVar26 == (uint *)0x0) {
                        iVar20 = 0xc;
                        pcVar33 = "Can\'t allocate memory for a filter descriptor.";
                        goto LAB_0056653e;
                      }
                      uVar11 = (rar_00->cstate).filters.size;
                      uVar8 = (rar_00->cstate).filters.cap_mask;
                      if (uVar8 + 1 != (uint)uVar11) {
                        uVar9 = (rar_00->cstate).filters.end_pos;
                        (rar_00->cstate).filters.arr[uVar9] = (size_t)puVar26;
                        (rar_00->cstate).filters.end_pos = uVar8 & uVar9 + 1;
                        (rar_00->cstate).filters.size = uVar11 + 1;
                      }
                      *puVar26 = local_21c >> 0xd;
                      lVar29 = local_200 + (rar_00->cstate).write_ptr;
                      *(long *)(puVar26 + 4) = lVar29;
                      *(ulong *)(puVar26 + 6) = local_1f8;
                      (rar_00->cstate).last_block_start = lVar29;
                      (rar_00->cstate).last_block_length = local_1f8;
                      prVar46 = local_260;
                      pdVar35 = local_240;
                      if (0x1fff < (local_21c & 0xffff)) goto LAB_0056607f;
                      wVar19 = read_consume_bits(a,rar_00,puVar49,L'\x05',&local_238);
                      prVar47 = local_268;
                      if (wVar19 != L'\0') goto LAB_00566554;
                      puVar26[1] = local_238 + L'\x01';
                      prVar46 = local_260;
                      pdVar35 = local_240;
                      goto LAB_0056607f;
                    }
                  }
                  iVar20 = 0x54;
                  pcVar33 = "Invalid filter encountered";
                  goto LAB_0056653e;
                }
                wVar19 = (prVar28->cstate).dist_cache[uVar32 - 0x102];
                uVar37 = (ulong)(uVar32 - 0x102);
                if (0x102 < uVar32) {
                  do {
                    (prVar28->cstate).dist_cache[uVar37] = (prVar28->cstate).dist_cache[uVar37 - 1];
                    bVar14 = 1 < uVar37;
                    uVar37 = uVar37 - 1;
                  } while (bVar14);
                }
                (prVar28->cstate).dist_cache[0] = wVar19;
                wVar17 = decode_number(a,local_230,puVar49,(uint16_t *)local_1e8);
                if (wVar17 != L'\0') goto LAB_00566545;
                wVar17 = decode_code_length(a,prVar28,puVar49,local_1e8._0_2_);
                if (wVar17 == L'\xffffffff') goto LAB_00566545;
                (prVar28->cstate).last_len = wVar17;
                wVar19 = copy_string((archive_read *)a->format->data,wVar17,wVar19);
              }
              else {
                wVar17 = decode_code_length(a,prVar28,puVar49,local_232 - 0x106);
                if (wVar17 == L'\xffffffff') {
                  iVar20 = 0x16;
                  pcVar33 = "Failed to decode the code length";
                  goto LAB_0056653e;
                }
                wVar19 = decode_number(a,local_228,puVar49,(uint16_t *)local_218);
                if (wVar19 != L'\0') {
LAB_005664b8:
                  iVar20 = 0x16;
                  pcVar33 = "Failed to decode the distance slot";
                  goto LAB_0056653e;
                }
                if ((ushort)local_218[0] < 4) {
                  wVar19 = (local_218[0] & 0xffff) + L'\x01';
                }
                else {
                  uVar11 = (ushort)local_218[0] >> 1;
                  wVar19 = (uint)uVar11 + L'\xffffffff';
                  iVar20 = ((local_218[0] & 1 | 2) << ((byte)wVar19 & 0x1f)) + 1;
                  if ((uint)wVar19 < 4) {
                    wVar19 = read_consume_bits(a,prVar28,puVar49,wVar19,(wchar_t *)local_1e8);
                    prVar47 = local_268;
                    if (wVar19 != L'\0') goto LAB_00566554;
                    wVar19 = iVar20 + local_1e8._0_4_;
                  }
                  else {
                    if (wVar19 != L'\x04') {
                      wVar19 = (prVar28->bits).in_addr;
                      lVar29 = (long)wVar19;
                      if ((prVar28->cstate).cur_block_size <= lVar29) {
                        iVar20 = 0x16;
                        pcVar33 = "Premature end of stream during extraction of data (#1)";
LAB_0056653e:
                        archive_set_error(&a->archive,iVar20,pcVar33);
LAB_00566545:
                        wVar19 = L'\xffffffe2';
                        prVar47 = local_268;
                        goto LAB_00566554;
                      }
                      uVar32 = *(uint *)(puVar49 + lVar29);
                      bVar16 = (prVar28->bits).bit_addr;
                      bVar5 = puVar49[lVar29 + 4];
                      iVar18 = (int)(char)bVar16 + (uint)uVar11 + -5;
                      (prVar28->bits).in_addr = (iVar18 >> 3) + wVar19;
                      (prVar28->bits).bit_addr = (byte)iVar18 & 7;
                      iVar20 = iVar20 + (((uint)(bVar5 >> (8 - bVar16 & 0x1f)) |
                                         (uVar32 >> 0x18 | (uVar32 & 0xff0000) >> 8 |
                                          (uVar32 & 0xff00) << 8 | uVar32 << 0x18) <<
                                         (bVar16 & 0x1f)) >> (0x25U - (char)uVar11 & 0x1f)) * 0x10;
                    }
                    wVar19 = decode_number(a,local_1f0,puVar49,(uint16_t *)local_1e8);
                    if (wVar19 != L'\0') goto LAB_005664b8;
                    if ((int)(0x7ffffffe - (uint)(ushort)local_1e8._0_2_) <= iVar20) {
                      iVar20 = 0x54;
                      pcVar33 = "Distance pointer overflow";
                      goto LAB_0056653e;
                    }
                    wVar19 = iVar20 + (uint)(ushort)local_1e8._0_2_;
                  }
                }
                if (L'Ā' < wVar19) {
                  if ((uint)wVar19 < 0x2001) {
                    wVar17 = wVar17 + L'\x01';
                  }
                  else {
                    wVar17 = (wVar17 - (uint)((uint)wVar19 < 0x40001)) + L'\x03';
                  }
                }
                (prVar28->cstate).dist_cache[3] = (prVar28->cstate).dist_cache[2];
                *(undefined8 *)((prVar28->cstate).dist_cache + 1) =
                     *(undefined8 *)(prVar28->cstate).dist_cache;
                (prVar28->cstate).dist_cache[0] = wVar19;
                (prVar28->cstate).last_len = wVar17;
                wVar19 = copy_string((archive_read *)a->format->data,wVar17,wVar19);
                prVar46 = local_260;
              }
              pdVar35 = local_240;
              if (wVar19 != L'\0') goto LAB_00566545;
LAB_0056607f:
              if ((prVar28->cstate).window_size >> 1 <
                  (prVar28->cstate).write_ptr - (prVar28->cstate).last_write_ptr) goto LAB_0056609e;
              goto LAB_00565b9d;
            }
LAB_0056609e:
            prVar47 = local_268;
            bVar16 = *(byte *)&prVar46->cstate;
            if ((bVar16 & 0xc) == 8) {
              lVar29 = (prVar46->cstate).cur_block_size;
              if (0 < lVar29) {
                iVar27 = __archive_read_consume(a,lVar29);
                if (iVar27 != lVar29) {
                  return L'\xffffffe2';
                }
                (prVar46->file).bytes_remaining =
                     (prVar46->file).bytes_remaining - (prVar46->cstate).cur_block_size;
              }
            }
            else if ((bVar16 & 4) != 0) {
              *(byte *)&prVar46->cstate = bVar16 & 0xfb;
            }
          }
          else {
LAB_00566554:
            if ((wVar19 == L'\xffffffe2') || (wVar19 == L'\x01')) goto LAB_00566587;
          }
          prVar46 = local_268;
        } while ((prVar47->cstate).last_write_ptr == (prVar47->cstate).write_ptr);
      }
      prVar46 = (rar5 *)a->format->data;
      bVar16 = *(byte *)&prVar46->cstate;
      *(byte *)&prVar46->cstate = bVar16 & 0xfd;
      if ((prVar46->cstate).filters.size != 0) {
        puVar26 = (uint *)(prVar46->cstate).filters.arr[(prVar46->cstate).filters.beg_pos];
        lVar29 = (prVar46->cstate).write_ptr;
        lVar30 = *(long *)(puVar26 + 4);
        if ((lVar30 < lVar29) && (*(long *)(puVar26 + 6) + lVar30 <= lVar29)) {
          lVar29 = (prVar46->cstate).last_write_ptr;
          if (lVar29 != lVar30) {
            push_window_data(a,prVar46,lVar29,lVar30);
            goto LAB_005665ae;
          }
          prVar47 = (rar5 *)a->format->data;
          free((prVar47->cstate).filtered_buf);
          puVar22 = *(uint8_t **)(puVar26 + 6);
          prVar28 = (rar5 *)malloc((size_t)puVar22);
          (prVar47->cstate).filtered_buf = (uint8_t *)prVar28;
          a = local_248;
          if (prVar28 == (rar5 *)0x0) {
            pcVar33 = "Can\'t allocate memory for filter data.";
LAB_0056669a:
            iVar20 = 0xc;
            goto LAB_00565667;
          }
          uVar32 = *puVar26;
          puVar49 = (uint8_t *)(ulong)uVar32;
          local_250 = puVar49;
          if (1 < uVar32 - 1) {
            if (uVar32 == 3) {
              puVar49 = (prVar47->cstate).window_buf;
              uVar37 = (prVar47->cstate).window_mask;
              uVar41 = *(long *)(puVar26 + 4) + (prVar47->cstate).solid_offset;
              puVar42 = (uint8_t *)(uVar41 & uVar37);
              local_250 = (uint8_t *)((ulong)(puVar22 + uVar41) & uVar37);
              if (local_250 < puVar42) {
                local_260 = prVar28;
                local_258 = puVar49;
                memcpy(prVar28,puVar42 + (long)puVar49,(uVar37 - (long)puVar42) + 1);
                prVar28 = (rar5 *)((long)local_260 + (uVar37 - (long)puVar42) + 1);
                puVar42 = local_250;
                puVar49 = local_258;
              }
              else {
                puVar49 = puVar49 + (long)puVar42;
                puVar42 = puVar22;
              }
              memcpy(prVar28,puVar49,(size_t)puVar42);
              if (3 < (long)puVar22) {
                uVar37 = 0;
                do {
                  prVar28 = (rar5 *)(prVar47->cstate).window_buf;
                  uVar41 = (prVar47->cstate).window_mask;
                  local_250 = *(uint8_t **)(puVar26 + 4);
                  if (*(uint8_t *)
                       ((long)&prVar28->header_initialized +
                       ((ulong)(local_250 + (prVar47->cstate).solid_offset + uVar37 + 3) & uVar41))
                      == 0xeb) {
                    uVar32 = (int)(local_250 + (prVar47->cstate).solid_offset) + (int)uVar37 &
                             (uint)uVar41;
                    uVar43 = (ulong)uVar32;
                    uVar32 = uVar32 + 4;
                    sVar34 = (size_t)((uint)uVar41 & uVar32);
                    if (sVar34 < uVar43) {
                      local_258 = (uint8_t *)(uVar41 - uVar43);
                      local_260 = prVar28;
                      memcpy(local_1e8,(uint8_t *)((long)&prVar28->header_initialized + uVar43),
                             (size_t)(local_258 + 1));
                      puVar49 = local_258 + (long)local_1e8 + 1;
                      prVar28 = local_260;
                    }
                    else {
                      prVar28 = (rar5 *)((long)&prVar28->header_initialized + uVar43);
                      sVar34 = uVar32 - uVar43;
                      puVar49 = local_1e8;
                    }
                    memcpy(puVar49,prVar28,sVar34);
                    puVar22 = local_250 + uVar37;
                    puVar49 = puVar22 + 3;
                    if (-1 < (long)puVar22) {
                      puVar49 = puVar22;
                    }
                    iVar20 = local_1e8._0_4_ - (int)((ulong)puVar49 >> 2);
                    puVar49 = (prVar47->cstate).filtered_buf;
                    uVar41 = uVar37 & 0xffffffff;
                    puVar49[uVar41] = (uint8_t)iVar20;
                    puVar49[uVar41 + 1] = (uint8_t)((uint)iVar20 >> 8);
                    puVar49[uVar41 + 2] = (uint8_t)((uint)iVar20 >> 0x10);
                    puVar49[uVar41 + 3] = 0xeb;
                    puVar22 = *(uint8_t **)(puVar26 + 6);
                  }
                  uVar37 = uVar37 + 4;
                } while ((long)uVar37 < (long)(puVar22 + -3));
              }
            }
            else {
              if (uVar32 != 0) {
                pcVar33 = "Unsupported filter type: 0x%x";
                goto LAB_00566646;
              }
              uVar32 = puVar26[1];
              if (0 < (int)uVar32) {
                lVar29 = 0;
                lVar30 = 0;
                do {
                  if (lVar29 < (long)puVar22) {
                    uVar39 = '\0';
                    lVar44 = lVar29;
                    do {
                      uVar39 = uVar39 - (prVar47->cstate).window_buf
                                        [(prVar47->cstate).solid_offset + *(long *)(puVar26 + 4) +
                                         lVar30 & (prVar47->cstate).window_mask];
                      (prVar47->cstate).filtered_buf[lVar44] = uVar39;
                      lVar30 = lVar30 + 1;
                      uVar32 = puVar26[1];
                      lVar45 = (long)(int)uVar32;
                      lVar44 = lVar44 + lVar45;
                      puVar22 = *(uint8_t **)(puVar26 + 6);
                    } while (lVar44 < (long)puVar22);
                  }
                  else {
                    lVar45 = (long)(int)uVar32;
                  }
                  lVar29 = lVar29 + 1;
                } while (lVar29 < lVar45);
              }
            }
            goto LAB_00566ad1;
          }
          pdVar35 = (decode_table *)(prVar47->cstate).window_buf;
          uVar37 = (prVar47->cstate).window_mask;
          uVar41 = *(long *)(puVar26 + 4) + (prVar47->cstate).solid_offset;
          puVar49 = (uint8_t *)(uVar41 & uVar37);
          local_258 = (uint8_t *)((ulong)(puVar22 + uVar41) & uVar37);
          if (local_258 < puVar49) {
            local_260 = prVar28;
            local_240 = pdVar35;
            memcpy(prVar28,puVar49 + (long)pdVar35,(uVar37 - (long)puVar49) + 1);
            prVar28 = (rar5 *)((long)local_260 + (uVar37 - (long)puVar49) + 1);
            puVar49 = local_258;
            pdVar35 = local_240;
          }
          else {
            pdVar35 = (decode_table *)(puVar49 + (long)(pdVar35->decode_len + -1));
            puVar49 = puVar22;
          }
          memcpy(prVar28,pdVar35,(size_t)puVar49);
          if ((long)puVar22 < 5) goto LAB_00566ad1;
          pdVar35 = (decode_table *)0x0;
          goto LAB_0056686b;
        }
      }
      *(byte *)&prVar46->cstate = bVar16 | 2;
      if ((prVar47->cstate).filters.size == 0) {
        lVar29 = (prVar47->cstate).write_ptr;
      }
      else {
        lVar30 = *(long *)((prVar47->cstate).filters.arr[(prVar47->cstate).filters.beg_pos] + 0x10);
        lVar29 = (prVar47->cstate).write_ptr;
        if (lVar30 < lVar29) {
          lVar29 = lVar30;
        }
      }
      lVar30 = (prVar47->cstate).last_write_ptr;
      wVar19 = L'\xfffffff6';
      if (lVar29 != lVar30) {
        push_window_data(a,prVar47,lVar30,lVar29);
        (prVar47->cstate).last_write_ptr = lVar29;
        goto LAB_005665ae;
      }
LAB_00566587:
      paVar15 = local_248;
    } while (wVar19 == L'\xfffffff6');
  }
  else {
LAB_00566596:
    wVar19 = do_unstore_file(a,rar,buff,size,offset);
  }
  if (wVar19 != L'\0') {
    return wVar19;
  }
LAB_005665ae:
  wVar19 = L'\0';
  if (((rar->file).bytes_remaining == 0) &&
     (wVar19 = L'\0', (rar->cstate).last_write_ptr == (rar->file).unpacked_size)) {
    puVar3 = &(rar->file).field_0x20;
    *puVar3 = *puVar3 | 4;
    wVar19 = verify_global_checksums(a);
  }
  return wVar19;
LAB_0056686b:
  do {
    pdVar13 = (decode_table *)(prVar47->cstate).window_buf;
    uVar37 = (prVar47->cstate).window_mask;
    lVar29 = (prVar47->cstate).solid_offset + *(long *)(puVar26 + 4);
    pdVar36 = (decode_table *)((long)&pdVar35->size + 1);
    cVar6 = *(char *)((long)pdVar13->decode_len +
                     (((long)pdVar35->decode_len + lVar29 + -4 & uVar37) - 4));
    if ((cVar6 == -0x18) || ((int)local_250 == 2 && cVar6 == -0x17)) {
      local_260 = (rar5 *)((long)pdVar36->decode_len + *(long *)(puVar26 + 4) + -4);
      iVar20 = (int)local_260 + 0xffffff;
      if (-1 < (long)local_260) {
        iVar20 = (int)local_260;
      }
      local_258 = (uint8_t *)CONCAT44(local_258._4_4_,iVar20);
      uVar32 = (int)lVar29 + (int)pdVar36 & (uint)uVar37;
      prVar28 = (rar5 *)(ulong)uVar32;
      uVar32 = uVar32 + 4;
      local_268 = (rar5 *)(ulong)((uint)uVar37 & uVar32);
      local_240 = pdVar36;
      if (local_268 < prVar28) {
        local_230 = (decode_table *)(uVar37 - (long)prVar28);
        local_228 = pdVar13;
        memcpy(local_1e8,(void *)((long)pdVar13->decode_len + (long)&prVar28[-1].field_0x532c),
               (size_t)((long)&local_230->size + 1));
        __dest = (undefined8 *)((long)local_230->decode_len + (long)&local_1f0 + 5);
        prVar28 = local_268;
        pdVar36 = local_228;
      }
      else {
        pdVar36 = (decode_table *)
                  ((long)((decode_table *)(pdVar13->decode_len + -1))->decode_len +
                  (long)&prVar28[-1].field_0x532c);
        prVar28 = (rar5 *)((ulong)uVar32 - (long)prVar28);
        __dest = (undefined8 *)local_1e8;
      }
      memcpy(__dest,pdVar36,(size_t)prVar28);
      iVar20 = (int)local_260 - ((uint)local_258 & 0xff000000);
      if ((int)local_1e8._0_4_ < L'\0') {
        if (-1 < iVar20 + local_1e8._0_4_) {
          wVar19 = local_1e8._0_4_ + L'\x01000000';
          wVar17 = local_1e8._0_4_;
          goto LAB_00566970;
        }
      }
      else if ((uint)local_1e8._0_4_ < 0x1000000) {
        wVar19 = local_1e8._0_4_ - iVar20;
        wVar17 = wVar19;
LAB_00566970:
        puVar49 = (prVar47->cstate).filtered_buf;
        uVar37 = (ulong)local_240 & 0xffffffff;
        puVar49[uVar37] = (uint8_t)wVar17;
        puVar49[uVar37 + 1] = (uint8_t)((uint)wVar17 >> 8);
        puVar49[uVar37 + 2] = (uint8_t)((uint)wVar17 >> 0x10);
        puVar49[uVar37 + 3] = (uint8_t)((uint)wVar19 >> 0x18);
        puVar22 = *(uint8_t **)(puVar26 + 6);
      }
      pdVar36 = (decode_table *)((long)pdVar35->decode_len + 1);
    }
    pdVar35 = pdVar36;
  } while ((long)pdVar36 < (long)(puVar22 + -4));
LAB_00566ad1:
  wVar19 = push_data_ready(local_248,prVar47,(prVar47->cstate).filtered_buf,(size_t)puVar22,
                           (prVar47->cstate).last_write_ptr);
  if (wVar19 != L'\0') {
    pcVar33 = "Stack overflow when submitting unpacked data";
    a = local_248;
LAB_00565662:
    iVar20 = 0x16;
LAB_00565667:
    archive_set_error(&a->archive,iVar20,pcVar33);
    return L'\xffffffe2';
  }
  piVar1 = &(prVar47->cstate).last_write_ptr;
  *piVar1 = *piVar1 + *(long *)(puVar26 + 6);
  uVar10 = (prVar46->cstate).filters.size;
  if (uVar10 != 0) {
    uVar11 = (prVar46->cstate).filters.beg_pos;
    puVar26 = (uint *)(prVar46->cstate).filters.arr[uVar11];
    (prVar46->cstate).filters.beg_pos = uVar11 + 1 & (prVar46->cstate).filters.cap_mask;
    (prVar46->cstate).filters.size = uVar10 - 1;
  }
  free(puVar26);
  a = local_248;
  goto LAB_005665ae;
}

Assistant:

static int rar5_read_data(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset) {
	int ret;
	struct rar5* rar = get_context(a);

	if (size)
		*size = 0;

	if(rar->file.dir > 0) {
		/* Don't process any data if this file entry was declared
		 * as a directory. This is needed, because entries marked as
		 * directory doesn't have any dictionary buffer allocated, so
		 * it's impossible to perform any decompression. */
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't decompress an entry marked as a directory");
		return ARCHIVE_FAILED;
	}

	if(!rar->skip_mode && (rar->cstate.last_write_ptr > rar->file.unpacked_size)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
		    "Unpacker has written too many bytes");
		return ARCHIVE_FATAL;
	}

	ret = use_data(rar, buff, size, offset);
	if(ret == ARCHIVE_OK) {
		return ret;
	}

	if(rar->file.eof == 1) {
		return ARCHIVE_EOF;
	}

	ret = do_unpack(a, rar, buff, size, offset);
	if(ret != ARCHIVE_OK) {
		return ret;
	}

	if(rar->file.bytes_remaining == 0 &&
			rar->cstate.last_write_ptr == rar->file.unpacked_size)
	{
		/* If all bytes of current file were processed, run
		 * finalization.
		 *
		 * Finalization will check checksum against proper values. If
		 * some of the checksums will not match, we'll return an error
		 * value in the last `archive_read_data` call to signal an error
		 * to the user. */

		rar->file.eof = 1;
		return verify_global_checksums(a);
	}

	return ARCHIVE_OK;
}